

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

void __thiscall ieee754::set_infinity(ieee754 *this,int neg)

{
  memset(this->buf,0,(long)this->bytes);
  set_exp(this,this->emax + 1);
  this->buf[(long)this->bytes + -1] = (neg != 0) << 7 | this->buf[(long)this->bytes + -1] & 0x7f;
  return;
}

Assistant:

void set_infinity(int neg)
    {
        /* 
         *   Infinity is represented with the maximum exponent plus one, and
         *   the mantissa set to all zeros.  Infinities can be positive or
         *   negative, so set the sign bit.  
         */
        memset(buf, 0, bytes);
        set_exp(emax + 1);
        set_sign(neg);
    }